

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.c
# Opt level: O2

void col_sort_int(int *integers,int *cols,int N)

{
  int i;
  void *__base;
  ulong uVar1;
  ulong uVar2;
  
  __base = chk_alloc(N,8);
  uVar1 = 0;
  uVar2 = 0;
  if (0 < N) {
    uVar2 = (ulong)(uint)N;
  }
  for (; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    *(int *)((long)__base + uVar1 * 8) = integers[uVar1];
    *(int *)((long)__base + uVar1 * 8 + 4) = (int)uVar1;
  }
  qsort(__base,(long)N,8,cmp_int);
  for (uVar1 = 0; uVar2 != uVar1; uVar1 = uVar1 + 1) {
    cols[uVar1] = *(int *)((long)__base + uVar1 * 8 + 4);
  }
  free(__base);
  return;
}

Assistant:

void col_sort_int(int *integers,int *cols, int N){
    struct str_int *objects;
    objects=chk_alloc (N, sizeof *objects);
    for (int i = 0; i < N; i++)
    {
        objects[i].value = integers[i];
        objects[i].index = i;
    }
    //sort objects array according to value using qsort
    qsort(objects, N, sizeof(objects[0]), cmp_int);
    for (int i = 0; i < N; i++)
        cols[i]=objects[i].index;

    free(objects);

}